

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

sexp_conflict sexp_current_signal_mask_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  int iVar1;
  sigset_t *__oset;
  sexp_conflict psVar2;
  sexp_gc_var_t local_30;
  sexp_conflict local_20;
  
  local_30.var = &local_20;
  local_20 = (sexp_conflict)0x43e;
  local_30.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_30;
  __oset = (sigset_t *)calloc(1,0x81);
  iVar1 = sigprocmask(0,(sigset_t *)0x0,__oset);
  psVar2 = (sexp_conflict)0x3e;
  if (iVar1 == 0) {
    psVar2 = (sexp_conflict)sexp_make_cpointer(ctx,(long)(self->value).type.dl >> 1,__oset,0x3e,1);
  }
  (ctx->value).context.saves = local_30.next;
  return psVar2;
}

Assistant:

sexp sexp_current_signal_mask_stub (sexp ctx, sexp self, sexp_sint_t n) {
  int err = 0;
  sigset_t *tmp2;
  sexp res;
  sexp_gc_var1(res2);
  sexp_gc_preserve1(ctx, res2);
  tmp2 = (sigset_t*) calloc(1, 1 + sizeof(tmp2[0]));
  err = sigprocmask(SIG_BLOCK, NULL, tmp2);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res2 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_opcode_arg3_type(self)), tmp2, SEXP_FALSE, 1);
  res = res2;
  }
  sexp_gc_release1(ctx);
  return res;
}